

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O2

void __thiscall QMarkdownTextEdit::paintEvent(QMarkdownTextEdit *this,QPaintEvent *e)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  byte bVar7;
  char cVar8;
  int iVar9;
  long lVar10;
  QWidget *this_00;
  QTextOption *pQVar11;
  bool bVar12;
  QPaintDevice *pQVar13;
  undefined4 uVar14;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  QRect QVar15;
  QColor QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QPainter painter;
  double local_160;
  QTextOption opt;
  undefined1 auStack_154 [12];
  char16_t *pcStack_150;
  double local_148;
  double dStack_140;
  QTextCursor cursor;
  QTextBlock block;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  QPainterPath path;
  undefined1 local_d8 [16];
  double dStack_90;
  QColor local_68;
  double local_58;
  QColor local_40;
  
  QPlainTextEdit::firstVisibleBlock();
  lVar10 = QAbstractScrollArea::viewport();
  pQVar13 = (QPaintDevice *)(lVar10 + 0x10);
  if (lVar10 == 0) {
    pQVar13 = (QPaintDevice *)0x0;
  }
  QPainter::QPainter(&painter,pQVar13);
  this_00 = (QWidget *)QAbstractScrollArea::viewport();
  QVar15 = QWidget::rect(this_00);
  local_58 = (double)QPlainTextEdit::contentOffset();
  local_d8._8_8_ = in_XMM1_Qb;
  local_d8._0_8_ = in_XMM1_Qa;
  local_108 = 0.0;
  dStack_100 = 0.0;
  local_118 = 0.0;
  dStack_110 = 0.0;
  QVar16 = MarkdownHighlighter::codeBlockBackgroundColor();
  local_40._0_8_ = QVar16._0_8_;
  local_40.ct._4_4_ = QVar16.ct._4_4_;
  local_40.ct.argb.pad = QVar16.ct._8_2_;
  dVar2 = (double)((QVar15.y2 - QVar15.y1) + 1);
  bVar12 = true;
  bVar6 = false;
  local_160 = 0.0;
  bVar7 = 0;
  bVar4 = false;
  do {
    bVar5 = QTextBlock::isValid();
    if (bVar6 || (~bVar5 & 1) != 0) {
      QPainter::end();
      QPlainTextEdit::paintEvent((QPaintEvent *)this);
      QPainter::~QPainter(&painter);
      return;
    }
    QPlainTextEdit::blockBoundingRect((QTextBlock *)&opt);
    dVar3 = local_58 + (double)_opt;
    auVar1._8_4_ = SUB84((double)local_d8._0_8_ + (double)pcStack_150,0);
    auVar1._0_8_ = dVar3;
    auVar1._12_4_ = (int)((ulong)((double)local_d8._0_8_ + (double)pcStack_150) >> 0x20);
    iVar9 = QTextBlock::userState();
    dStack_90 = auVar1._8_8_;
    if (bVar4) {
      if ((iVar9 != 100) && (iVar9 != 0x61)) goto LAB_0011474b;
LAB_00114792:
      bVar4 = false;
      dStack_100 = local_160;
      bVar12 = true;
    }
    else {
      bVar6 = MarkdownHighlighter::isCodeBlock(iVar9);
      if (bVar6) {
        QTextBlock::text();
        QVar17.m_data = (char *)0x3;
        QVar17.m_size = (qsizetype)&opt;
        cVar8 = QString::startsWith(QVar17,0x142953);
        if (cVar8 == '\0') {
          QTextBlock::text();
          QVar18.m_data = (char *)0x3;
          QVar18.m_size = (qsizetype)&path;
          cVar8 = QString::startsWith(QVar18,0x142957);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&path);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&opt);
          if (cVar8 == '\0') {
            dStack_110 = dStack_90;
            local_108 = local_148;
            dStack_100 = dStack_140;
            bVar4 = true;
            local_160 = 0.0;
            local_118 = dVar3;
          }
        }
        else {
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&opt);
        }
        QTextBlock::previous();
        iVar9 = QTextBlock::userState();
        if (bVar12) {
          bVar6 = MarkdownHighlighter::isCodeBlock(iVar9);
          bVar7 = bVar6 | bVar7;
        }
      }
LAB_0011474b:
      if (bVar4) {
        QPlainTextEdit::document();
        QTextDocument::lastBlock();
        bVar12 = false;
        if ((block.p == _opt) && (bVar12 = false, block.n == (int)pcStack_150)) {
          local_160 = local_160 + dStack_140;
          goto LAB_00114792;
        }
      }
      else {
        bVar12 = false;
      }
    }
    uVar14 = local_d8._12_4_;
    dVar3 = (double)local_d8._0_8_ + dStack_140;
    local_160 = local_160 + dStack_140;
    local_d8._8_4_ = local_d8._8_4_;
    local_d8._0_8_ = dVar3;
    local_d8._12_4_ = uVar14;
    bVar6 = dVar2 < dVar3;
    if (((dVar2 < dVar3) && (dVar3 = local_160, bVar4)) || (dVar3 = dStack_100, bVar12)) {
      dStack_100 = dVar3;
      QPainter::setCompositionMode((CompositionMode)&painter);
      QPainter::setPen((PenStyle)&painter);
      QBrush::QBrush((QBrush *)&opt,&local_40,SolidPattern);
      QPainter::setBrush((QBrush *)&painter);
      QBrush::~QBrush((QBrush *)&opt);
      if (bVar7 == 0) {
        bVar7 = 0;
        QPainter::drawRoundedRect(&painter,&local_118,0);
      }
      else {
        QPainterPath::QPainterPath(&path);
        QPainterPath::setFillRule((FillRule)(QRectF *)&path);
        QPainterPath::addRoundedRect(0,0x4014000000000000,(QRectF *)&path,&local_118,0);
        local_148 = local_108 + 0.0;
        dStack_140 = dStack_100 * -0.5 + dStack_100;
        pcStack_150._0_4_ = SUB84(dStack_110 + 0.0,0);
        _opt = (QTextDocumentPrivate *)(local_118 + 0.0);
        unique0x100003e9 = (int)((ulong)(dStack_110 + 0.0) >> 0x20);
        QPainterPath::addRect((QRectF *)&path);
        QPainterPath::simplified();
        QPainter::drawPath((QPainterPath *)&painter);
        QPainterPath::~QPainterPath((QPainterPath *)&opt);
        QPainterPath::~QPainterPath(&path);
        bVar7 = 0;
      }
    }
    QTextBlock::text();
    cVar8 = QString::isRightToLeft();
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&opt);
    if (cVar8 != '\0') {
      pQVar11 = (QTextOption *)QTextBlock::layout();
      QTextOption::QTextOption(&opt,2);
      _opt = _opt & 0xffff3fff | 0x4000;
      QTextLayout::setTextOption(pQVar11);
      QTextOption::~QTextOption(&opt);
    }
    QPlainTextEdit::textCursor();
    if (this->_highlightCurrentLine == true) {
      QTextCursor::block();
      if ((_opt == block.p) && ((int)pcStack_150 == block.n)) {
        iVar9 = QTextBlock::layout();
        QTextCursor::positionInBlock();
        _path = QTextLayout::lineForTextPosition(iVar9);
        QTextLine::rect();
        _opt = (QTextDocumentPrivate *)((0.0 - (double)_opt) + (double)_opt);
        pcStack_150 = (char16_t *)(dStack_90 + (double)pcStack_150);
        local_148 = (double)((QVar15.x2 - QVar15.x1) + 1) - (double)_opt;
        QVar16 = (QColor)QRectF::toAlignedRect();
        local_68 = QVar16;
        QPainter::fillRect((QRect *)&painter,&local_68);
      }
    }
    QTextBlock::next();
    block.p = _opt;
    block.n = (int)pcStack_150;
    QTextCursor::~QTextCursor(&cursor);
    bVar12 = false;
  } while( true );
}

Assistant:

void QMarkdownTextEdit::paintEvent(QPaintEvent *e) {
    QTextBlock block = firstVisibleBlock();

    QPainter painter(viewport());
    const QRect viewportRect = viewport()->rect();
    // painter.fillRect(viewportRect, Qt::transparent);
    bool firstVisible = true;
    QPointF offset(contentOffset());
    QRectF blockAreaRect;    // Code or block quote rect.
    bool inBlockArea = false;

    bool clipTop = false;
    bool drawBlock = false;
    qreal dy = 0.0;
    bool done = false;

    const QColor &color = MarkdownHighlighter::codeBlockBackgroundColor();
    const int cornerRadius = 5;

    while (block.isValid() && !done) {
        const QRectF r = blockBoundingRect(block).translated(offset);
        const int state = block.userState();

        if (!inBlockArea && MarkdownHighlighter::isCodeBlock(state)) {
            // skip the backticks
            if (!block.text().startsWith(QLatin1String("```")) &&
                !block.text().startsWith(QLatin1String("~~~"))) {
                blockAreaRect = r;
                dy = 0.0;
                inBlockArea = true;
            }

            // If this is the first visible block within the viewport
            // and if the previous block is part of the text block area,
            // then the rectangle to draw for the block area will have
            // its top clipped by the viewport and will need to be
            // drawn specially.
            const int prevBlockState = block.previous().userState();
            if (firstVisible &&
                MarkdownHighlighter::isCodeBlock(prevBlockState)) {
                clipTop = true;
            }
        }
        // Else if the block ends a text block area...
        else if (inBlockArea && MarkdownHighlighter::isCodeBlockEnd(state)) {
            drawBlock = true;
            inBlockArea = false;
            blockAreaRect.setHeight(dy);
        }
        // If the block is at the end of the document and ends a text
        // block area...
        //
        if (inBlockArea && block == this->document()->lastBlock()) {
            drawBlock = true;
            inBlockArea = false;
            dy += r.height();
            blockAreaRect.setHeight(dy);
        }
        offset.ry() += r.height();
        dy += r.height();

        // If this is the last text block visible within the viewport...
        if (offset.y() > viewportRect.height()) {
            if (inBlockArea) {
                blockAreaRect.setHeight(dy);
                drawBlock = true;
            }

            // Finished drawing.
            done = true;
        }
        // If this is the last text block visible within the viewport...
        if (offset.y() > viewportRect.height()) {
            if (inBlockArea) {
                blockAreaRect.setHeight(dy);
                drawBlock = true;
            }
            // Finished drawing.
            done = true;
        }

        if (drawBlock) {
            painter.setCompositionMode(QPainter::CompositionMode_SourceOver);
            painter.setPen(Qt::NoPen);
            painter.setBrush(QBrush(color));

            // If the first visible block is "clipped" such that the previous
            // block is part of the text block area, then only draw a rectangle
            // with the bottom corners rounded, and with the top corners square
            // to reflect that the first visible block is part of a larger block
            // of text.
            //
            if (clipTop) {
                QPainterPath path;
                path.setFillRule(Qt::WindingFill);
                path.addRoundedRect(blockAreaRect, cornerRadius, cornerRadius);
                qreal adjustedHeight = blockAreaRect.height() / 2;
                path.addRect(blockAreaRect.adjusted(0, 0, 0, -adjustedHeight));
                painter.drawPath(path.simplified());
                clipTop = false;
            }
            // Else draw the entire rectangle with all corners rounded.
            else {
                painter.drawRoundedRect(blockAreaRect, cornerRadius,
                                        cornerRadius);
            }

            drawBlock = false;
        }

        // this fixes the RTL bug of QPlainTextEdit
        // https://bugreports.qt.io/browse/QTBUG-7516
        if (block.text().isRightToLeft()) {
            QTextLayout *layout = block.layout();
            // opt = document()->defaultTextOption();
            QTextOption opt = QTextOption(Qt::AlignRight);
            opt.setTextDirection(Qt::RightToLeft);
            layout->setTextOption(opt);
        }

        // Current line highlight
        QTextCursor cursor = textCursor();
        if (highlightCurrentLine() && cursor.block() == block) {
            QTextLine line = block.layout()->lineForTextPosition(cursor.positionInBlock());
            QRectF lineRect = line.rect();
            lineRect.moveTop(lineRect.top() + r.top());
            lineRect.setLeft(0.);
            lineRect.setRight(viewportRect.width());
            painter.fillRect(lineRect.toAlignedRect(), currentLineHighlightColor());
        }

        block = block.next();
        firstVisible = false;
    }

    painter.end();
    QPlainTextEdit::paintEvent(e);
}